

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O1

void TTD::NSSnapObjects::AssertSnapEquiv_SnapPromiseAllSettledResolveOrRejectElementFunctionInfo
               (SnapObject *sobj1,SnapObject *sobj2,TTDCompareMap *compareMap)

{
  SnapPromiseCapabilityInfo *capabilityInfo1;
  SnapPromiseCapabilityInfo *capabilityInfo2;
  
  if ((sobj1->SnapObjectTag == SnapPromiseAllSettledResolveOrRejectElementFunctionObject) &&
     (sobj2->SnapObjectTag == SnapPromiseAllSettledResolveOrRejectElementFunctionObject)) {
    capabilityInfo1 = (SnapPromiseCapabilityInfo *)sobj1->AddtlSnapObjectInfo;
    capabilityInfo2 = (SnapPromiseCapabilityInfo *)sobj2->AddtlSnapObjectInfo;
    NSSnapValues::AssertSnapEquiv(capabilityInfo1,capabilityInfo2,compareMap);
    TTDCompareMap::DiagnosticAssert
              (compareMap,
               (int)capabilityInfo1[1].CapabilityId == (int)capabilityInfo2[1].CapabilityId);
    TTDCompareMap::DiagnosticAssert
              (compareMap,
               *(int *)&capabilityInfo1[1].ResolveVar == *(int *)&capabilityInfo2[1].ResolveVar);
    TTDCompareMap::DiagnosticAssert
              (compareMap,
               (char)capabilityInfo1[2].CapabilityId == (char)capabilityInfo2[2].CapabilityId);
    TTDCompareMap::DiagnosticAssert
              (compareMap,
               *(char *)((long)&capabilityInfo1[2].CapabilityId + 1) ==
               *(char *)((long)&capabilityInfo2[2].CapabilityId + 1));
    TTDCompareMap::CheckConsistentAndAddPtrIdMapping_Special
              (compareMap,(TTD_PTR_ID)capabilityInfo1[2].PromiseVar,
               (TTD_PTR_ID)capabilityInfo2[2].PromiseVar,L"values");
    TTDCompareMap::CheckConsistentAndAddPtrIdMapping_NoEnqueue
              (compareMap,(TTD_PTR_ID)capabilityInfo1[1].PromiseVar,
               (TTD_PTR_ID)capabilityInfo2[1].PromiseVar);
    TTDCompareMap::CheckConsistentAndAddPtrIdMapping_NoEnqueue
              (compareMap,(TTD_PTR_ID)capabilityInfo1[1].RejectVar,
               (TTD_PTR_ID)capabilityInfo2[1].RejectVar);
    return;
  }
  TTDAbort_unrecoverable_error("Tag does not match.");
}

Assistant:

void AssertSnapEquiv_SnapPromiseAllSettledResolveOrRejectElementFunctionInfo(const SnapObject* sobj1, const SnapObject* sobj2, TTDCompareMap& compareMap)
        {
            SnapPromiseAllSettledResolveOrRejectElementFunctionInfo* aInfo1 = SnapObjectGetAddtlInfoAs<SnapPromiseAllSettledResolveOrRejectElementFunctionInfo*, SnapObjectType::SnapPromiseAllSettledResolveOrRejectElementFunctionObject>(sobj1);
            SnapPromiseAllSettledResolveOrRejectElementFunctionInfo* aInfo2 = SnapObjectGetAddtlInfoAs<SnapPromiseAllSettledResolveOrRejectElementFunctionInfo*, SnapObjectType::SnapPromiseAllSettledResolveOrRejectElementFunctionObject>(sobj2);

            NSSnapValues::AssertSnapEquiv(&aInfo1->Capabilities, &aInfo2->Capabilities, compareMap);

            compareMap.DiagnosticAssert(aInfo1->Index == aInfo2->Index);
            compareMap.DiagnosticAssert(aInfo1->RemainingElementsValue == aInfo2->RemainingElementsValue);
            compareMap.DiagnosticAssert(aInfo1->AlreadyCalledValue == aInfo2->AlreadyCalledValue);
            compareMap.DiagnosticAssert(aInfo1->IsRejecting == aInfo2->IsRejecting);

            compareMap.CheckConsistentAndAddPtrIdMapping_Special(aInfo1->Values, aInfo2->Values, _u("values"));

            compareMap.CheckConsistentAndAddPtrIdMapping_NoEnqueue(aInfo1->RemainingElementsWrapperId, aInfo2->RemainingElementsWrapperId);
            compareMap.CheckConsistentAndAddPtrIdMapping_NoEnqueue(aInfo1->AlreadyCalledWrapperId, aInfo2->AlreadyCalledWrapperId);
        }